

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  BtShared *pBt_00;
  int iVar1;
  BtShared *pBt;
  int rc;
  int bCleanup_local;
  Btree *p_local;
  
  if (p->inTrans != '\0') {
    sqlite3BtreeEnter(p);
    if (p->inTrans == '\x02') {
      pBt_00 = p->pBt;
      iVar1 = sqlite3PagerCommitPhaseTwo(pBt_00->pPager);
      if ((iVar1 != 0) && (bCleanup == 0)) {
        sqlite3BtreeLeave(p);
        return iVar1;
      }
      pBt_00->inTransaction = '\x01';
      btreeClearHasContent(pBt_00);
    }
    btreeEndTransaction(p);
    sqlite3BtreeLeave(p);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees 
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}